

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  *this;
  vector<std::variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>,_std::allocator<std::variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>_>_>
  *pvVar1;
  row *prVar2;
  iterator pvVar3;
  iterator pvVar4;
  socklen_t in_ECX;
  sockaddr *__addr;
  resultset<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  *prVar5;
  row *r_3;
  string_view local_380;
  prepared_statement<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  local_370;
  undefined1 auStack_348 [8];
  array<std::variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>,_2UL>
  select_values;
  row *r_2;
  string_view local_2a0;
  undefined1 local_290 [8];
  prepared_statement<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  stmt;
  array<std::variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>,_2UL>
  update_values;
  row *r_1;
  resultset<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  local_218;
  row *local_1a8;
  row *r;
  undefined1 local_190 [8];
  resultset<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  result;
  basic_string_view<char,_std::char_traits<char>_> local_110;
  basic_string_view<char,_std::char_traits<char>_> local_100;
  address_v4 local_ec;
  address local_e8;
  undefined1 local_c8 [8];
  endpoint ep;
  undefined1 local_a0 [8];
  connection<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  conn;
  io_context ctx;
  
  boost::asio::io_context::io_context((io_context *)&conn.curr_stmt_num_);
  psql::
  connection<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
  ::connection<boost::asio::io_context&>
            ((connection<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
              *)local_a0,(io_context *)&conn.curr_stmt_num_);
  boost::asio::ip::address_v4::loopback();
  boost::asio::ip::address::address(&local_e8,&local_ec);
  boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint
            ((basic_endpoint<boost::asio::ip::tcp> *)local_c8,&local_e8,0x1538);
  this = &psql::
          connection<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
          ::next_layer((connection<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
                        *)local_a0)->
          super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ;
  boost::asio::
  basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::connect(this,(int)local_c8,__addr,in_ECX);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&result.complete_,"postgres");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_110,"postgres");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_100,"awesome");
  psql::
  connection<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  ::handshake((connection<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
               *)local_a0,(connection_params *)&result.complete_);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&r,
             "UPDATE mytable SET f1 = 100 WHERE f2 = \'adios\'");
  psql::
  connection<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  ::query((resultset<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
           *)local_190,
          (connection<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
           *)local_a0,_r);
  while( true ) {
    local_1a8 = psql::
                resultset<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
                ::fetch_one((resultset<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
                             *)local_190);
    if (local_1a8 == (row *)0x0) break;
    pvVar1 = psql::row::values(local_1a8);
    print(pvVar1);
  }
  std::operator<<((ostream *)&std::cout,"UPDATE complete\n\n");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&r_1,"SELECT * FROM \"mytable\";");
  psql::
  connection<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  ::query(&local_218,
          (connection<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
           *)local_a0,_r_1);
  psql::
  resultset<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  ::operator=((resultset<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
               *)local_190,&local_218);
  psql::
  resultset<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  ::~resultset(&local_218);
  while( true ) {
    prVar2 = psql::
             resultset<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
             ::fetch_one((resultset<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
                          *)local_190);
    if (prVar2 == (row *)0x0) break;
    pvVar1 = psql::row::values(prVar2);
    print(pvVar1);
  }
  std::operator<<((ostream *)&std::cout,"SELECT complete\n\n");
  stmt.name_.field_2._8_8_ = 0x96;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_2a0,"UPDATE mytable SET f1 = $1 WHERE f2 = $2");
  psql::
  connection<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  ::prepare_statement((prepared_statement<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
                       *)local_290,
                      (connection<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
                       *)local_a0,local_2a0);
  pvVar3 = std::
           begin<std::array<std::variant<int,long,unsigned_int,unsigned_long,std::basic_string_view<char,std::char_traits<char>>,float,double,std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<int,std::ratio<86400l,1l>>>,std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000l>>>,std::chrono::duration<long,std::ratio<1l,1000000l>>,decltype(nullptr)>,2ul>>
                     ((array<std::variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>,_2UL>
                       *)((long)&stmt.name_.field_2 + 8));
  pvVar4 = std::
           end<std::array<std::variant<int,long,unsigned_int,unsigned_long,std::basic_string_view<char,std::char_traits<char>>,float,double,std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<int,std::ratio<86400l,1l>>>,std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000l>>>,std::chrono::duration<long,std::ratio<1l,1000000l>>,decltype(nullptr)>,2ul>>
                     ((array<std::variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>,_2UL>
                       *)((long)&stmt.name_.field_2 + 8));
  psql::
  prepared_statement<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
  ::
  execute<std::variant<int,long,unsigned_int,unsigned_long,std::basic_string_view<char,std::char_traits<char>>,float,double,std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<int,std::ratio<86400l,1l>>>,std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000l>>>,std::chrono::duration<long,std::ratio<1l,1000000l>>,decltype(nullptr)>*>
            ((resultset<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
              *)&r_2,local_290,pvVar3,pvVar4);
  prVar5 = (resultset<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
            *)&r_2;
  psql::
  resultset<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  ::operator=((resultset<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
               *)local_190,prVar5);
  psql::
  resultset<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  ::~resultset((resultset<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
                *)&r_2);
  while( true ) {
    select_values._M_elems[1].
    super__Variant_base<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
    .
    super__Move_assign_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
    .
    super__Copy_assign_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
    .
    super__Move_ctor_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
    .
    super__Copy_ctor_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
    .
    super__Variant_storage_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
    ._16_8_ = psql::
              resultset<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
              ::fetch_one((resultset<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
                           *)local_190);
    if ((row *)select_values._M_elems[1].
               super__Variant_base<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
               .
               super__Move_assign_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
               .
               super__Copy_assign_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
               .
               super__Move_ctor_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
               .
               super__Copy_ctor_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
               .
               super__Variant_storage_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
               ._16_8_ == (row *)0x0) break;
    pvVar1 = psql::row::values((row *)select_values._M_elems[1].
                                      super__Variant_base<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
                                      .
                                      super__Move_assign_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
                                      .
                                      super__Copy_assign_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
                                      .
                                      super__Move_ctor_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
                                      .
                                      super__Copy_ctor_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
                                      .
                                      super__Variant_storage_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
                                      ._16_8_);
    print(pvVar1);
  }
  psql::
  prepared_statement<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  ::close((prepared_statement<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
           *)local_290,(int)prVar5);
  std::operator<<((ostream *)&std::cout,"Prepared UPDATE complete\n\n");
  select_values._M_elems[1].
  super__Variant_base<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Move_assign_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Copy_assign_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Move_ctor_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Copy_ctor_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Variant_storage_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  ._M_u._M_rest._0_8_ = (undefined8)anon_var_dwarf_223c6;
  select_values._M_elems[1].
  super__Variant_base<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Move_assign_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Copy_assign_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Move_ctor_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Copy_ctor_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Variant_storage_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  ._M_u._8_8_ = 4;
  select_values._M_elems[0].
  super__Variant_base<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Move_assign_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Copy_assign_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Move_ctor_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Copy_ctor_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Variant_storage_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  ._M_u._8_8_ = 4;
  select_values._M_elems[0].
  super__Variant_base<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Move_assign_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Copy_assign_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Move_ctor_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Copy_ctor_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Variant_storage_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  ._M_index = '\x06';
  select_values._M_elems[0].
  super__Variant_base<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Move_assign_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Copy_assign_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Move_ctor_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Copy_ctor_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Variant_storage_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  ._17_7_ = 0;
  auStack_348 = (undefined1  [8])0x4;
  select_values._M_elems[0].
  super__Variant_base<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Move_assign_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Copy_assign_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Move_ctor_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Copy_ctor_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  .
  super__Variant_storage_alias<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>
  ._M_u._M_rest._0_8_ = (undefined8)anon_var_dwarf_223ad;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_380,"SELECT * FROM mytable WHERE f2 IN ($1, $2)");
  psql::
  connection<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  ::prepare_statement(&local_370,
                      (connection<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
                       *)local_a0,local_380);
  psql::
  prepared_statement<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  ::operator=((prepared_statement<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
               *)local_290,&local_370);
  psql::
  prepared_statement<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  ::~prepared_statement(&local_370);
  pvVar3 = std::
           begin<std::array<std::variant<int,long,unsigned_int,unsigned_long,std::basic_string_view<char,std::char_traits<char>>,float,double,std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<int,std::ratio<86400l,1l>>>,std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000l>>>,std::chrono::duration<long,std::ratio<1l,1000000l>>,decltype(nullptr)>,2ul>>
                     ((array<std::variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>,_2UL>
                       *)auStack_348);
  pvVar4 = std::
           end<std::array<std::variant<int,long,unsigned_int,unsigned_long,std::basic_string_view<char,std::char_traits<char>>,float,double,std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<int,std::ratio<86400l,1l>>>,std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000l>>>,std::chrono::duration<long,std::ratio<1l,1000000l>>,decltype(nullptr)>,2ul>>
                     ((array<std::variant<int,_long,_unsigned_int,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>,_float,_double,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::nullptr_t>,_2UL>
                       *)auStack_348);
  psql::
  prepared_statement<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
  ::
  execute<std::variant<int,long,unsigned_int,unsigned_long,std::basic_string_view<char,std::char_traits<char>>,float,double,std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<int,std::ratio<86400l,1l>>>,std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000l>>>,std::chrono::duration<long,std::ratio<1l,1000000l>>,decltype(nullptr)>*>
            ((resultset<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
              *)&r_3,local_290,pvVar3,pvVar4);
  prVar5 = (resultset<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
            *)&r_3;
  psql::
  resultset<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  ::operator=((resultset<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
               *)local_190,prVar5);
  psql::
  resultset<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  ::~resultset((resultset<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
                *)&r_3);
  while( true ) {
    prVar2 = psql::
             resultset<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
             ::fetch_one((resultset<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
                          *)local_190);
    if (prVar2 == (row *)0x0) break;
    pvVar1 = psql::row::values(prVar2);
    print(pvVar1);
  }
  psql::
  prepared_statement<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  ::close((prepared_statement<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
           *)local_290,(int)prVar5);
  std::operator<<((ostream *)&std::cout,"Prepared SELECT complete\n\n");
  psql::
  prepared_statement<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  ::~prepared_statement
            ((prepared_statement<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
              *)local_290);
  psql::
  resultset<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  ::~resultset((resultset<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
                *)local_190);
  psql::
  connection<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  ::~connection((connection<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
                 *)local_a0);
  boost::asio::io_context::~io_context((io_context *)&conn.curr_stmt_num_);
  return 0;
}

Assistant:

int main()
{
	// Connection
	net::io_context ctx;
	connection<tcp::socket> conn (ctx);
	boost::asio::ip::tcp::endpoint ep (boost::asio::ip::address_v4::loopback(), 5432);

	// Handshake
	conn.next_layer().connect(ep);
	conn.handshake(connection_params{
		"postgres",
		"postgres",
		"awesome"
	});

	// Query (resultset without fields)
	auto result = conn.query("UPDATE mytable SET f1 = 100 WHERE f2 = 'adios'");
	while (const row* r = result.fetch_one())
	{
		print(r->values());
	}
	std::cout << "UPDATE complete\n\n";

	// Query (resultset with fields)
	result = conn.query("SELECT * FROM \"mytable\";");
	while (const row* r = result.fetch_one())
	{
		print(r->values());
	}
	std::cout << "SELECT complete\n\n";

	// Prepared statement (resultset without fields)
	std::array<value, 2> update_values { value(150), value("adios") };
	auto stmt = conn.prepare_statement("UPDATE mytable SET f1 = $1 WHERE f2 = $2");
	result = stmt.execute(std::begin(update_values), std::end(update_values));
	while (const row* r = result.fetch_one())
	{
		print(r->values());
	}
	stmt.close();
	std::cout << "Prepared UPDATE complete\n\n";


	std::array<value, 2> select_values { value("hola"), value("quetal") };
	stmt = conn.prepare_statement("SELECT * FROM mytable WHERE f2 IN ($1, $2)");
	result = stmt.execute(std::begin(select_values), std::end(select_values));
	while (const row* r = result.fetch_one())
	{
		print(r->values());
	}
	stmt.close();
	std::cout << "Prepared SELECT complete\n\n";
}